

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blend_a64_vmask_sse4.c
# Opt level: O2

void aom_blend_a64_vmask_sse4_1
               (uint8_t *dst,uint32_t dst_stride,uint8_t *src0,uint32_t src0_stride,uint8_t *src1,
               uint32_t src1_stride,uint8_t *mask,int w,int h)

{
  byte bVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  long lVar6;
  uint uVar7;
  uint uVar8;
  int iVar9;
  ulong uVar10;
  uint uVar11;
  uint uVar12;
  bool bVar13;
  undefined1 in_XMM0 [16];
  undefined1 auVar14 [16];
  short sVar15;
  short sVar17;
  undefined1 auVar16 [16];
  short sVar18;
  short sVar19;
  short sVar20;
  short sVar21;
  short sVar22;
  short sVar23;
  short sVar24;
  short sVar25;
  undefined1 in_XMM4 [16];
  short sVar26;
  short sVar28;
  short sVar29;
  short sVar30;
  short sVar31;
  short sVar32;
  short sVar33;
  undefined1 in_XMM5 [16];
  undefined1 auVar27 [16];
  short sVar34;
  undefined1 in_XMM6 [16];
  undefined1 auVar35 [16];
  
  switch(w & 0xf) {
  case 0:
    auVar14 = pmovsxbw(in_XMM0,0x4040404040404040);
    do {
      auVar16 = pshuflw(ZEXT116(*mask),ZEXT116(*mask),0);
      sVar15 = auVar16._0_2_;
      sVar18 = auVar14._0_2_ - sVar15;
      sVar17 = auVar16._2_2_;
      sVar19 = auVar14._2_2_ - sVar17;
      sVar20 = auVar14._4_2_ - sVar15;
      sVar21 = auVar14._6_2_ - sVar17;
      sVar22 = auVar14._8_2_ - sVar15;
      sVar23 = auVar14._10_2_ - sVar17;
      sVar24 = auVar14._12_2_ - sVar15;
      sVar25 = auVar14._14_2_ - sVar17;
      for (lVar6 = 0; lVar6 < w; lVar6 = lVar6 + 0x10) {
        auVar16 = pmovzxbw(in_XMM4,*(undefined8 *)(src0 + lVar6));
        auVar27 = pmovzxbw(in_XMM5,*(undefined8 *)(src1 + lVar6));
        auVar35._0_2_ = auVar16._0_2_ * sVar15;
        auVar35._2_2_ = auVar16._2_2_ * sVar17;
        auVar35._4_2_ = auVar16._4_2_ * sVar15;
        auVar35._6_2_ = auVar16._6_2_ * sVar17;
        auVar35._8_2_ = auVar16._8_2_ * sVar15;
        auVar35._10_2_ = auVar16._10_2_ * sVar17;
        auVar35._12_2_ = auVar16._12_2_ * sVar15;
        auVar35._14_2_ = auVar16._14_2_ * sVar17;
        sVar26 = pavgw((ushort)(auVar27._0_2_ * sVar18 + auVar35._0_2_) >> 5,0);
        sVar28 = pavgw((ushort)(auVar27._2_2_ * sVar19 + auVar35._2_2_) >> 5,0);
        sVar29 = pavgw((ushort)(auVar27._4_2_ * sVar20 + auVar35._4_2_) >> 5,0);
        sVar30 = pavgw((ushort)(auVar27._6_2_ * sVar21 + auVar35._6_2_) >> 5,0);
        sVar31 = pavgw((ushort)(auVar27._8_2_ * sVar22 + auVar35._8_2_) >> 5,0);
        sVar32 = pavgw((ushort)(auVar27._10_2_ * sVar23 + auVar35._10_2_) >> 5,0);
        sVar33 = pavgw((ushort)(auVar27._12_2_ * sVar24 + auVar35._12_2_) >> 5,0);
        sVar34 = pavgw((ushort)(auVar27._14_2_ * sVar25 + auVar35._14_2_) >> 5,0);
        auVar16 = pmovzxbw(auVar35,*(undefined8 *)(src0 + lVar6 + 8));
        auVar35 = pmovzxbw(in_XMM6,*(undefined8 *)(src1 + lVar6 + 8));
        in_XMM4._0_2_ = auVar16._0_2_ * sVar15;
        in_XMM4._2_2_ = auVar16._2_2_ * sVar17;
        in_XMM4._4_2_ = auVar16._4_2_ * sVar15;
        in_XMM4._6_2_ = auVar16._6_2_ * sVar17;
        in_XMM4._8_2_ = auVar16._8_2_ * sVar15;
        in_XMM4._10_2_ = auVar16._10_2_ * sVar17;
        in_XMM4._12_2_ = auVar16._12_2_ * sVar15;
        in_XMM4._14_2_ = auVar16._14_2_ * sVar17;
        in_XMM6._0_2_ = pavgw((ushort)(auVar35._0_2_ * sVar18 + in_XMM4._0_2_) >> 5,0);
        in_XMM6._2_2_ = pavgw((ushort)(auVar35._2_2_ * sVar19 + in_XMM4._2_2_) >> 5,0);
        in_XMM6._4_2_ = pavgw((ushort)(auVar35._4_2_ * sVar20 + in_XMM4._4_2_) >> 5,0);
        in_XMM6._6_2_ = pavgw((ushort)(auVar35._6_2_ * sVar21 + in_XMM4._6_2_) >> 5,0);
        in_XMM6._8_2_ = pavgw((ushort)(auVar35._8_2_ * sVar22 + in_XMM4._8_2_) >> 5,0);
        in_XMM6._10_2_ = pavgw((ushort)(auVar35._10_2_ * sVar23 + in_XMM4._10_2_) >> 5,0);
        in_XMM6._12_2_ = pavgw((ushort)(auVar35._12_2_ * sVar24 + in_XMM4._12_2_) >> 5,0);
        in_XMM6._14_2_ = pavgw((ushort)(auVar35._14_2_ * sVar25 + in_XMM4._14_2_) >> 5,0);
        in_XMM5[1] = (0 < sVar28) * (sVar28 < 0x100) * (char)sVar28 - (0xff < sVar28);
        in_XMM5[0] = (0 < sVar26) * (sVar26 < 0x100) * (char)sVar26 - (0xff < sVar26);
        in_XMM5[2] = (0 < sVar29) * (sVar29 < 0x100) * (char)sVar29 - (0xff < sVar29);
        in_XMM5[3] = (0 < sVar30) * (sVar30 < 0x100) * (char)sVar30 - (0xff < sVar30);
        in_XMM5[4] = (0 < sVar31) * (sVar31 < 0x100) * (char)sVar31 - (0xff < sVar31);
        in_XMM5[5] = (0 < sVar32) * (sVar32 < 0x100) * (char)sVar32 - (0xff < sVar32);
        in_XMM5[6] = (0 < sVar33) * (sVar33 < 0x100) * (char)sVar33 - (0xff < sVar33);
        in_XMM5[7] = (0 < sVar34) * (sVar34 < 0x100) * (char)sVar34 - (0xff < sVar34);
        in_XMM5[8] = (0 < in_XMM6._0_2_) * (in_XMM6._0_2_ < 0x100) * (char)in_XMM6._0_2_ -
                     (0xff < in_XMM6._0_2_);
        in_XMM5[9] = (0 < in_XMM6._2_2_) * (in_XMM6._2_2_ < 0x100) * (char)in_XMM6._2_2_ -
                     (0xff < in_XMM6._2_2_);
        in_XMM5[10] = (0 < in_XMM6._4_2_) * (in_XMM6._4_2_ < 0x100) * (char)in_XMM6._4_2_ -
                      (0xff < in_XMM6._4_2_);
        in_XMM5[0xb] = (0 < in_XMM6._6_2_) * (in_XMM6._6_2_ < 0x100) * (char)in_XMM6._6_2_ -
                       (0xff < in_XMM6._6_2_);
        in_XMM5[0xc] = (0 < in_XMM6._8_2_) * (in_XMM6._8_2_ < 0x100) * (char)in_XMM6._8_2_ -
                       (0xff < in_XMM6._8_2_);
        in_XMM5[0xd] = (0 < in_XMM6._10_2_) * (in_XMM6._10_2_ < 0x100) * (char)in_XMM6._10_2_ -
                       (0xff < in_XMM6._10_2_);
        in_XMM5[0xe] = (0 < in_XMM6._12_2_) * (in_XMM6._12_2_ < 0x100) * (char)in_XMM6._12_2_ -
                       (0xff < in_XMM6._12_2_);
        in_XMM5[0xf] = (0 < in_XMM6._14_2_) * (in_XMM6._14_2_ < 0x100) * (char)in_XMM6._14_2_ -
                       (0xff < in_XMM6._14_2_);
        *(undefined1 (*) [16])(dst + lVar6) = in_XMM5;
      }
      dst = dst + dst_stride;
      src0 = src0 + src0_stride;
      src1 = src1 + src1_stride;
      mask = mask + 1;
      h = h + -1;
    } while (h != 0);
    return;
  default:
    uVar4 = 0;
    uVar2 = (ulong)(uint)w;
    if (w < 1) {
      uVar2 = uVar4;
    }
    uVar3 = (ulong)(uint)h;
    if (h < 1) {
      uVar3 = uVar4;
    }
    uVar8 = 0;
    uVar7 = 0;
  }
  for (uVar10 = 0; uVar10 != uVar3; uVar10 = uVar10 + 1) {
    bVar1 = mask[uVar10];
    iVar9 = (int)uVar4;
    uVar5 = uVar2;
    uVar11 = uVar8;
    uVar12 = uVar7;
    while( true ) {
      bVar13 = uVar5 == 0;
      uVar5 = uVar5 - 1;
      if (bVar13) break;
      dst[uVar12] = (uint8_t)((uint)src0[uVar4] * (uint)bVar1 +
                              (uint)src1[uVar11] * (0x40 - (uint)bVar1) + 0x20 >> 6);
      uVar12 = uVar12 + 1;
      uVar11 = uVar11 + 1;
      uVar4 = (ulong)((int)uVar4 + 1);
    }
    uVar7 = uVar7 + dst_stride;
    uVar8 = uVar8 + src1_stride;
    uVar4 = (ulong)(iVar9 + src0_stride);
  }
  return;
}

Assistant:

void aom_blend_a64_vmask_sse4_1(uint8_t *dst, uint32_t dst_stride,
                                const uint8_t *src0, uint32_t src0_stride,
                                const uint8_t *src1, uint32_t src1_stride,
                                const uint8_t *mask, int w, int h) {
  typedef void (*blend_fn)(uint8_t * dst, uint32_t dst_stride,
                           const uint8_t *src0, uint32_t src0_stride,
                           const uint8_t *src1, uint32_t src1_stride,
                           const uint8_t *mask, int w, int h);

  // Dimension: width_index
  static const blend_fn blend[9] = {
    blend_a64_vmask_w16n_sse4_1,  // w % 16 == 0
    aom_blend_a64_vmask_c,        // w == 1
    aom_blend_a64_vmask_c,        // w == 2
    NULL,                         // INVALID
    blend_a64_vmask_w4_sse4_1,    // w == 4
    NULL,                         // INVALID
    NULL,                         // INVALID
    NULL,                         // INVALID
    blend_a64_vmask_w8_sse4_1,    // w == 8
  };

  assert(IMPLIES(src0 == dst, src0_stride == dst_stride));
  assert(IMPLIES(src1 == dst, src1_stride == dst_stride));

  assert(h >= 1);
  assert(w >= 1);
  assert(IS_POWER_OF_TWO(h));
  assert(IS_POWER_OF_TWO(w));

  blend[w & 0xf](dst, dst_stride, src0, src0_stride, src1, src1_stride, mask, w,
                 h);
}